

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

bool __thiscall HighsLp::needsMods(HighsLp *this,double infinite_cost)

{
  bool bVar1;
  
  if (this->has_infinite_cost_ != false) {
    return true;
  }
  bVar1 = hasSemiVariables(this);
  return bVar1;
}

Assistant:

bool HighsLp::needsMods(const double infinite_cost) const {
  assert(this->has_infinite_cost_ == this->hasInfiniteCost(infinite_cost));
  return this->has_infinite_cost_ || this->hasSemiVariables();
}